

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

int __thiscall Vector::remove(Vector *this,char *__filename)

{
  unsigned_long k;
  unsigned_long l_local;
  Vector *this_local;
  
  if (__filename < (char *)this->vLength) {
    for (k = (unsigned_long)(__filename + 1); k < this->vLength; k = k + 1) {
      this->vData[k - 1] = this->vData[k];
    }
    this->vLength = this->vLength - 1;
    __filename = (char *)this;
  }
  return (int)__filename;
}

Assistant:

void Vector::remove(const unsigned long l) {
  if (l < vLength) {
    for (unsigned long k = l + 1; k < vLength; k++) {
      vData[k - 1] = vData[k];
    }
    vLength--;
  }
}